

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::tick(ut_metadata_peer_plugin *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator local_20;
  value_type local_14;
  ut_metadata_peer_plugin *puStack_10;
  int piece;
  ut_metadata_peer_plugin *this_local;
  
  puStack_10 = this;
  maybe_send_request(this);
  while( true ) {
    bVar2 = ::std::vector<int,_std::allocator<int>_>::empty(&this->m_incoming_requests);
    bVar1 = false;
    if (!bVar2) {
      iVar3 = libtorrent::aux::peer_connection::send_buffer_size(&this->m_pc->super_peer_connection)
      ;
      bVar1 = iVar3 < 0x28000;
    }
    if (!bVar1) break;
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::front(&this->m_incoming_requests);
    local_14 = *pvVar4;
    local_28._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin(&this->m_incoming_requests);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_20,
               &local_28);
    ::std::vector<int,_std::allocator<int>_>::erase(&this->m_incoming_requests,local_20);
    write_metadata_packet(this,piece,local_14);
  }
  return;
}

Assistant:

void tick() override
		{
			maybe_send_request();
			while (!m_incoming_requests.empty()
				&& m_pc.send_buffer_size() < send_buffer_limit)
			{
				int const piece = m_incoming_requests.front();
				m_incoming_requests.erase(m_incoming_requests.begin());
				write_metadata_packet(msg_t::piece, piece);
			}
		}